

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSplitDeque.h
# Opt level: O0

HighsTask * __thiscall
HighsSplitDeque::WorkerBunk::waitForNewTask(WorkerBunk *this,HighsSplitDeque *localDeque)

{
  long in_RSI;
  HighsBinarySemaphore *in_stack_00000088;
  HighsSplitDeque *in_stack_00000130;
  WorkerBunk *in_stack_00000138;
  
  pushSleeper(in_stack_00000138,in_stack_00000130);
  HighsBinarySemaphore::acquire(in_stack_00000088);
  return *(HighsTask **)(in_RSI + 0x88);
}

Assistant:

HighsTask* waitForNewTask(HighsSplitDeque* localDeque) {
      pushSleeper(localDeque);
      localDeque->stealerData.semaphore.acquire();
      return localDeque->stealerData.injectedTask;
    }